

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

void __thiscall serialization::xml_iarchive::xml_iarchive(xml_iarchive *this)

{
  char *pcVar1;
  
  (this->document_).super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  (this->document_).super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  (this->document_).super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  (this->document_).super_xml_node<char>.m_type = node_document;
  (this->document_).super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  (this->document_).super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  pcVar1 = (this->document_).super_memory_pool<char>.m_static_memory;
  (this->document_).super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  (this->document_).super_memory_pool<char>.m_free_func = (free_func *)0x0;
  (this->document_).super_memory_pool<char>.m_begin = pcVar1;
  (this->document_).super_memory_pool<char>.m_ptr = pcVar1;
  (this->document_).super_memory_pool<char>.m_end =
       (char *)&(this->document_).super_memory_pool<char>.m_alloc_func;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  _M_initialize_map((_Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                     *)&this->stack_,0);
  return;
}

Assistant:

xml_iarchive()
    {
    }